

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall QCalendarWidgetPrivate::_q_nextMonthClicked(QCalendarWidgetPrivate *this)

{
  QDate date;
  long in_FS_OFFSET;
  qint64 local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (qint64)getCurrentDate(this);
  date.jd = QDate::addMonths(&local_18,1,*(undefined8 *)&this->m_model->m_calendar);
  updateCurrentPage(this,date);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::_q_nextMonthClicked()
{
    QDate currentDate = getCurrentDate().addMonths(1, m_model->m_calendar);
    updateCurrentPage(currentDate);
}